

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

UChar32 ucase_tolower_63(UChar32 c)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  ushort *puVar6;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  uint local_28;
  int32_t delta;
  uint16_t excWord;
  uint16_t *pe;
  uint local_10;
  uint16_t props;
  UChar32 c_local;
  
  uVar3 = c >> 5;
  if ((uint)c < 0xd800) {
    local_34 = (uint)ucase_props_trieIndex[(int)uVar3] * 4 + (c & 0x1fU);
  }
  else {
    if ((uint)c < 0x10000) {
      iVar4 = 0;
      if (c < 0xdc00) {
        iVar4 = 0x140;
      }
      local_38 = (uint)ucase_props_trieIndex[(int)(iVar4 + uVar3)] * 4 + (c & 0x1fU);
    }
    else {
      if ((uint)c < 0x110000) {
        if (c < 0xe0800) {
          local_40 = (uint)ucase_props_trieIndex
                           [(int)((uint)ucase_props_trieIndex[(c >> 0xb) + 0x820] + (uVar3 & 0x3f))]
                     * 4 + (c & 0x1fU);
        }
        else {
          local_40 = 0x2f1c;
        }
        local_3c = local_40;
      }
      else {
        local_3c = 0xd30;
      }
      local_38 = local_3c;
    }
    local_34 = local_38;
  }
  uVar1 = ucase_props_trieIndex[local_34];
  local_10 = c;
  if ((uVar1 & 8) == 0) {
    if ((uVar1 & 2) != 0) {
      local_10 = ((int)(short)uVar1 >> 7) + c;
    }
  }
  else {
    lVar5 = (long)((int)(uint)uVar1 >> 4);
    puVar6 = ucase_props_exceptions + lVar5 + 1;
    uVar2 = ucase_props_exceptions[lVar5];
    if (((uVar2 & 0x10) != 0) && ((uVar1 & 2) != 0)) {
      if ((uVar2 & 0x100) == 0) {
        local_28 = (uint)puVar6[(int)(uint)""[(int)(uVar2 & 0xf)]];
      }
      else {
        local_28 = CONCAT22(puVar6[(int)((uint)""[(int)(uVar2 & 0xf)] << 1)],
                            (puVar6 + (int)((uint)""[(int)(uVar2 & 0xf)] << 1))[1]);
      }
      if ((uVar2 & 0x400) != 0) {
        local_28 = -local_28;
      }
      local_44 = c + local_28;
      return local_44;
    }
    if ((uVar2 & 1) != 0) {
      if ((uVar2 & 0x100) == 0) {
        local_10 = (uint)*puVar6;
      }
      else {
        local_10 = CONCAT22(*puVar6,ucase_props_exceptions[lVar5 + 2]);
      }
    }
  }
  return local_10;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
ucase_tolower(UChar32 c) {
    uint16_t props=UTRIE2_GET16(&ucase_props_singleton.trie, c);
    if(!UCASE_HAS_EXCEPTION(props)) {
        if(UCASE_IS_UPPER_OR_TITLE(props)) {
            c+=UCASE_GET_DELTA(props);
        }
    } else {
        const uint16_t *pe=GET_EXCEPTIONS(&ucase_props_singleton, props);
        uint16_t excWord=*pe++;
        if(HAS_SLOT(excWord, UCASE_EXC_DELTA) && UCASE_IS_UPPER_OR_TITLE(props)) {
            int32_t delta;
            GET_SLOT_VALUE(excWord, UCASE_EXC_DELTA, pe, delta);
            return (excWord&UCASE_EXC_DELTA_IS_NEGATIVE)==0 ? c+delta : c-delta;
        }
        if(HAS_SLOT(excWord, UCASE_EXC_LOWER)) {
            GET_SLOT_VALUE(excWord, UCASE_EXC_LOWER, pe, c);
        }
    }
    return c;
}